

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_extension_c_test.cc
# Opt level: O1

void __thiscall TestMalloc_Hook_Test::~TestMalloc_Hook_Test(TestMalloc_Hook_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestMalloc, Hook) {
  ASSERT_TRUE(MallocHook_AddNewHook(&TestNewHook));
  ASSERT_TRUE(MallocHook_AddDeleteHook(&TestDeleteHook));

  free(forced_malloc(10));
  free(forced_malloc(20));
  ASSERT_EQ(g_new_hook_calls, 2);
  ASSERT_EQ(g_delete_hook_calls, 2);
  ASSERT_TRUE(MallocHook_RemoveNewHook(&TestNewHook));

  ASSERT_TRUE(MallocHook_RemoveDeleteHook(&TestDeleteHook));

  free(forced_malloc(10));
  free(forced_malloc(20));
  ASSERT_EQ(g_new_hook_calls, 2);

  MallocHook_SetNewHook(&TestNewHook);
  MallocHook_SetDeleteHook(&TestDeleteHook);

  free(forced_malloc(10));
  free(forced_malloc(20));
  ASSERT_EQ(g_new_hook_calls, 4);

  ASSERT_NE(MallocHook_SetNewHook(nullptr), nullptr);
  ASSERT_NE(MallocHook_SetDeleteHook(nullptr), nullptr);
}